

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plycmd.cc
# Opt level: O1

int main(int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  char *__s;
  ostream *poVar5;
  Model *pMVar6;
  int __oflag;
  uint uVar7;
  bool merge_double_vertices;
  float scale;
  double ext_height;
  double ext_scale;
  string bout;
  string name;
  string p;
  string aout;
  string spath;
  Parameter param;
  PLYReader ply;
  char *def [29];
  float local_49c;
  double local_498;
  double local_490;
  string local_488;
  string local_468;
  string local_448;
  string local_428;
  string local_408;
  Parameter local_3e8;
  PLYReader local_358;
  char *local_118 [29];
  
  memcpy(local_118,&PTR_anon_var_dwarf_3234_00177390,0xe8);
  gutil::Parameter::Parameter(&local_3e8,argc,argv,local_118,(char *)0x0);
  if ((int)((ulong)((long)local_3e8.list.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_3e8.list.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start) >> 5) - (int)local_3e8.pos < 1)
  {
    gutil::Parameter::printHelp(&local_3e8,(ostream *)&std::cout,0x50);
    iVar3 = 10;
    bVar2 = false;
  }
  else {
    local_468._M_dataplus._M_p = (pointer)&local_468.field_2;
    local_468._M_string_length = 0;
    local_468.field_2._M_local_buf[0] = '\0';
    local_408._M_dataplus._M_p = (pointer)&local_408.field_2;
    local_408._M_string_length = 0;
    local_408.field_2._M_local_buf[0] = '\0';
    local_49c = 1.0;
    local_428._M_dataplus._M_p = (pointer)&local_428.field_2;
    local_428._M_string_length = 0;
    local_428.field_2._M_local_buf[0] = '\0';
    local_488._M_dataplus._M_p = (pointer)&local_488.field_2;
    local_488._M_string_length = 0;
    local_488.field_2._M_local_buf[0] = '\0';
    local_490 = 0.0;
    local_498 = 0.0;
    __s = getenv("CVKIT_SPATH");
    if (__s != (char *)0x0) {
      strlen(__s);
      std::__cxx11::string::_M_replace((ulong)&local_408,0,(char *)0x0,(ulong)__s);
    }
    bVar2 = gutil::Parameter::isNextParameter(&local_3e8);
    if (!bVar2) {
      gutil::Parameter::nextString(&local_3e8,&local_468,(char *)0x0);
    }
    uVar7 = 1;
    bVar2 = false;
    merge_double_vertices = false;
    do {
      if ((int)((ulong)((long)local_3e8.list.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)local_3e8.list.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 5) - (int)local_3e8.pos <
          1) {
        iVar3 = 0;
        bVar2 = true;
        if (local_488._M_string_length != 0 || local_428._M_string_length != 0) {
          if (local_468._M_string_length == 0) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"No input file given!",0x14);
            std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'X');
            std::ostream::put('X');
            std::ostream::flush();
            iVar3 = 10;
            bVar2 = false;
          }
          else {
            if ((local_490 <= 0.0) || (local_498 <= 0.0)) {
              pMVar6 = gvr::loadModel(local_468._M_dataplus._M_p,local_408._M_dataplus._M_p,true,
                                      merge_double_vertices);
            }
            else {
              pMVar6 = gvr::createModelFromContours(local_468._M_dataplus._M_p,local_490,local_498);
            }
            if ((local_49c != 1.0) || (NAN(local_49c))) {
              (*pMVar6->_vptr_Model[2])(pMVar6);
            }
            if (local_428._M_string_length != 0) {
              (*pMVar6->_vptr_Model[7])(pMVar6,local_428._M_dataplus._M_p,(ulong)uVar7,0);
            }
            if (local_488._M_string_length != 0) {
              if (local_488._M_string_length < 5) {
LAB_0011b858:
                (*pMVar6->_vptr_Model[7])(pMVar6,local_488._M_dataplus._M_p,(ulong)uVar7,1);
              }
              else {
                iVar4 = std::__cxx11::string::compare
                                  ((ulong)&local_488,local_488._M_string_length - 4,(char *)0x4);
                if (iVar4 != 0) {
                  iVar4 = std::__cxx11::string::compare
                                    ((ulong)&local_488,local_488._M_string_length - 4,(char *)0x4);
                  if (iVar4 != 0) goto LAB_0011b858;
                }
                (*pMVar6->_vptr_Model[8])(pMVar6,local_488._M_dataplus._M_p);
              }
            }
            if (pMVar6 != (Model *)0x0) {
              (*pMVar6->_vptr_Model[1])(pMVar6);
            }
          }
        }
        goto LAB_0011b88e;
      }
      local_448._M_dataplus._M_p = (pointer)&local_448.field_2;
      local_448._M_string_length = 0;
      local_448.field_2._M_local_buf[0] = '\0';
      gutil::Parameter::nextParameter(&local_3e8,&local_448);
      iVar3 = std::__cxx11::string::compare((char *)&local_448);
      if (iVar3 == 0) {
        gutil::Parameter::printHelp(&local_3e8,(ostream *)&std::cout,0x50);
LAB_0011b573:
        bVar1 = false;
      }
      else {
        iVar3 = std::__cxx11::string::compare((char *)&local_448);
        if (iVar3 == 0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"This program is part of cvkit version ",0x26);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"2.6.17",6);
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\b');
          std::ostream::put('\b');
          std::ostream::flush();
          goto LAB_0011b573;
        }
        iVar3 = std::__cxx11::string::compare((char *)&local_448);
        if (iVar3 == 0) {
          gutil::Parameter::nextString(&local_3e8,&local_408,(char *)0x0);
        }
        iVar3 = std::__cxx11::string::compare((char *)&local_448);
        if (iVar3 == 0) {
          local_358.filename._M_string_length = 0;
          local_358.filename.field_2._M_local_buf[0] = '\0';
          local_358.filename._M_dataplus._M_p = (pointer)&local_358.filename.field_2;
          std::ifstream::ifstream(&local_358.in);
          local_358.list.super__Vector_base<gvr::PLYElement_*,_std::allocator<gvr::PLYElement_*>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_358.list.super__Vector_base<gvr::PLYElement_*,_std::allocator<gvr::PLYElement_*>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_358.list.super__Vector_base<gvr::PLYElement_*,_std::allocator<gvr::PLYElement_*>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          iVar3 = gvr::PLYReader::open(&local_358,local_468._M_dataplus._M_p,__oflag);
          if ((char)iVar3 == '\0') {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"Not a ply file: ",0x10);
            poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cerr,local_468._M_dataplus._M_p,
                                local_468._M_string_length);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
            std::ostream::put((char)poVar5);
            std::ostream::flush();
          }
          else {
            gvr::PLYReader::printHeader(&local_358);
          }
          gvr::PLYReader::~PLYReader(&local_358);
        }
        iVar3 = std::__cxx11::string::compare((char *)&local_448);
        merge_double_vertices = bVar2;
        if (iVar3 == 0) {
          merge_double_vertices = true;
        }
        iVar3 = std::__cxx11::string::compare((char *)&local_448);
        if (iVar3 == 0) {
          uVar7 = 0;
        }
        iVar3 = std::__cxx11::string::compare((char *)&local_448);
        if (iVar3 == 0) {
          gutil::Parameter::nextValue<float>(&local_3e8,&local_49c);
        }
        iVar3 = std::__cxx11::string::compare((char *)&local_448);
        if (iVar3 == 0) {
          gutil::Parameter::nextValue<double>(&local_3e8,&local_490);
          gutil::Parameter::nextValue<double>(&local_3e8,&local_498);
        }
        iVar3 = std::__cxx11::string::compare((char *)&local_448);
        if (iVar3 == 0) {
          gutil::Parameter::nextString(&local_3e8,&local_428,(char *)0x0);
        }
        iVar3 = std::__cxx11::string::compare((char *)&local_448);
        bVar1 = true;
        bVar2 = merge_double_vertices;
        if (iVar3 == 0) {
          gutil::Parameter::nextString(&local_3e8,&local_488,(char *)0x0);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_448._M_dataplus._M_p != &local_448.field_2) {
        operator_delete(local_448._M_dataplus._M_p);
      }
    } while (bVar1);
    bVar2 = false;
    iVar3 = 0;
LAB_0011b88e:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_488._M_dataplus._M_p != &local_488.field_2) {
      operator_delete(local_488._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_428._M_dataplus._M_p != &local_428.field_2) {
      operator_delete(local_428._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_408._M_dataplus._M_p != &local_408.field_2) {
      operator_delete(local_408._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_468._M_dataplus._M_p != &local_468.field_2) {
      operator_delete(local_468._M_dataplus._M_p);
    }
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_3e8.allparam._M_t);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3e8.creat._M_dataplus._M_p != &local_3e8.creat.field_2) {
    operator_delete(local_3e8.creat._M_dataplus._M_p);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_3e8.def);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_3e8.list);
  if (bVar2) {
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

int main(int argc, char *argv[])
{
  try
  {
    const char *def[]=
    {
      "# plycmd <file> [<options>]",
      "#",
      "# The input file may be given in ply or stl format or as depth file. In case of a depth file, optional parameters may be appended to the file name, separated by commas. Parameters are:",
      "#",
      "# p=<parameter file>",
      "# i=<image file>",
      "# ds=<s>",
      "# x=<x>,y=<y>,w=<w>,h=<h>",
      "# s=<max step>",
      "#",
      "# Options are:",
      "#",
      "-help # Print help and exit.",
      "-version # Print version and exit.",
      "-spath # Search path for finding parameter files or images that are associated with the depth image. Default is the content of the environment variable CVKIT_SPATH.",
      " <dir list> # List of directories.",
      "-header # Print header of ply file.",
      "-merge # Merge double vertices. This only applies to STL files. Loading can take much longer.",
      "-reduce # Removes all data that is unnecessary for visualization.",
      "-mul # Multiply the given factor to all vertices.",
      " <s> # Scaling factor.",
      "-extrusion # Creates a ply file from contours of a binary image. Pixel of the brightest color are foreground, all others are background.",
      " <scale> # Factor scaling the x/y pixel coordinates.",
      " <height> # Height of object.",
      "-ascii # Store in ascii ply format.",
      " <file> # Output file.",
      "-out # Store in binary ply or stl format (depending on suffix).",
      " <file> # Output file.",
      0
    };

    gutil::Parameter param(argc, argv, def);

    if (param.remaining() < 1)
    {
      param.printHelp(std::cout);
      return 10;
    }

    // handle options

    std::string name;
    std::string spath;
    bool   merge=false;
    bool   all=true;
    float scale=1.0f;
    std::string aout;
    std::string bout;
    double ext_scale=0;
    double ext_height=0;

    if (getenv("CVKIT_SPATH") != 0)
    {
      spath=getenv("CVKIT_SPATH");
    }

    if (!param.isNextParameter())
    {
      param.nextString(name);
    }

    while (param.remaining() > 0)
    {
      std::string p;

      param.nextParameter(p);

      if (p == "-help")
      {
        param.printHelp(std::cout);
        return 0;
      }

      if (p == "-version")
      {
        std::cout << "This program is part of cvkit version " << VERSION << std::endl;
        return 0;
      }

      if (p == "-spath")
      {
        param.nextString(spath);
      }

      if (p == "-header")
      {
        gvr::PLYReader ply;

        if (ply.open(name.c_str()))
        {
          ply.printHeader();
        }
        else
        {
          std::cerr << "Not a ply file: " << name << std::endl;
        }
      }

      if (p == "-merge")
      {
        merge=true;
      }

      if (p == "-reduce")
      {
        all=false;
      }

      if (p == "-mul")
      {
        param.nextValue(scale);
      }

      if (p == "-extrusion")
      {
        param.nextValue(ext_scale);
        param.nextValue(ext_height);
      }

      if (p == "-ascii")
      {
        param.nextString(aout);
      }

      if (p == "-out")
      {
        param.nextString(bout);
      }
    }

    if (aout.size() > 0 || bout.size() > 0)
    {
      if (name.size() > 0)
      {
        gvr::Model *model=0;

        if (ext_scale > 0 && ext_height > 0)
        {
          model=gvr::createModelFromContours(name.c_str(), ext_scale, ext_height);
        }
        else
        {
          model=gvr::loadModel(name.c_str(), spath.c_str(), true, merge);
        }

        if (scale != 1.0f)
        {
          model->scale(scale);
        }

        if (aout.size() > 0)
        {
          model->savePLY(aout.c_str(), all, gvr::ply_ascii);
        }

        if (bout.size() > 0)
        {
          if (bout.size() > 4 && (bout.compare(bout.size()-4, 4, ".stl") == 0 ||
            bout.compare(bout.size()-4, 4, ".STL") == 0))
          {
            model->saveSTL(bout.c_str());
          }
          else
          {
            model->savePLY(bout.c_str(), all, gvr::ply_binary);
          }
        }

        delete model;
      }
      else
      {
        std::cerr << "No input file given!" << std::endl;
        return 10;
      }
    }
  }
  catch (const std::exception &ex)
  {
    std::cerr << ex.what() << std::endl;
  }

  return 0;
}